

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VNewEmpty_Serial(sunindextype length,SUNContext_conflict sunctx)

{
  N_Vector p_Var1;
  undefined8 *puVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  N_VectorContent_Serial content;
  N_Vector v;
  SUNContext_conflict sunctx_local_scope_;
  
  p_Var1 = (N_Vector)N_VNewEmpty(in_RSI);
  p_Var1->ops->nvgetvectorid = N_VGetVectorID_Serial;
  p_Var1->ops->nvclone = N_VClone_Serial;
  p_Var1->ops->nvcloneempty = N_VCloneEmpty_Serial;
  p_Var1->ops->nvdestroy = N_VDestroy_Serial;
  p_Var1->ops->nvspace = N_VSpace_Serial;
  p_Var1->ops->nvgetarraypointer = N_VGetArrayPointer_Serial;
  p_Var1->ops->nvsetarraypointer = N_VSetArrayPointer_Serial;
  p_Var1->ops->nvgetlength = N_VGetLength_Serial;
  p_Var1->ops->nvgetlocallength = N_VGetLength_Serial;
  p_Var1->ops->nvlinearsum = N_VLinearSum_Serial;
  p_Var1->ops->nvconst = N_VConst_Serial;
  p_Var1->ops->nvprod = N_VProd_Serial;
  p_Var1->ops->nvdiv = N_VDiv_Serial;
  p_Var1->ops->nvscale = N_VScale_Serial;
  p_Var1->ops->nvabs = N_VAbs_Serial;
  p_Var1->ops->nvinv = N_VInv_Serial;
  p_Var1->ops->nvaddconst = N_VAddConst_Serial;
  p_Var1->ops->nvdotprod = N_VDotProd_Serial;
  p_Var1->ops->nvmaxnorm = N_VMaxNorm_Serial;
  p_Var1->ops->nvwrmsnormmask = N_VWrmsNormMask_Serial;
  p_Var1->ops->nvwrmsnorm = N_VWrmsNorm_Serial;
  p_Var1->ops->nvmin = N_VMin_Serial;
  p_Var1->ops->nvwl2norm = N_VWL2Norm_Serial;
  p_Var1->ops->nvl1norm = N_VL1Norm_Serial;
  p_Var1->ops->nvcompare = N_VCompare_Serial;
  p_Var1->ops->nvinvtest = N_VInvTest_Serial;
  p_Var1->ops->nvconstrmask = N_VConstrMask_Serial;
  p_Var1->ops->nvminquotient = N_VMinQuotient_Serial;
  p_Var1->ops->nvdotprodlocal = N_VDotProd_Serial;
  p_Var1->ops->nvmaxnormlocal = N_VMaxNorm_Serial;
  p_Var1->ops->nvminlocal = N_VMin_Serial;
  p_Var1->ops->nvl1normlocal = N_VL1Norm_Serial;
  p_Var1->ops->nvinvtestlocal = N_VInvTest_Serial;
  p_Var1->ops->nvconstrmasklocal = N_VConstrMask_Serial;
  p_Var1->ops->nvminquotientlocal = N_VMinQuotient_Serial;
  p_Var1->ops->nvwsqrsumlocal = N_VWSqrSumLocal_Serial;
  p_Var1->ops->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_Serial;
  p_Var1->ops->nvdotprodmultilocal = N_VDotProdMulti_Serial;
  p_Var1->ops->nvbufsize = N_VBufSize_Serial;
  p_Var1->ops->nvbufpack = N_VBufPack_Serial;
  p_Var1->ops->nvbufunpack = N_VBufUnpack_Serial;
  p_Var1->ops->nvprint = N_VPrint_Serial;
  p_Var1->ops->nvprintfile = N_VPrintFile_Serial;
  puVar2 = (undefined8 *)malloc(0x18);
  p_Var1->content = puVar2;
  *puVar2 = in_RDI;
  *(undefined4 *)(puVar2 + 1) = 0;
  puVar2[2] = 0;
  return p_Var1;
}

Assistant:

N_Vector N_VNewEmpty_Serial(sunindextype length, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  N_Vector v;
  N_VectorContent_Serial content;

  SUNAssertNull(length >= 0, SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty vector object */
  v = NULL;
  v = N_VNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */

  /* constructors, destructors, and utility operations */
  v->ops->nvgetvectorid     = N_VGetVectorID_Serial;
  v->ops->nvclone           = N_VClone_Serial;
  v->ops->nvcloneempty      = N_VCloneEmpty_Serial;
  v->ops->nvdestroy         = N_VDestroy_Serial;
  v->ops->nvspace           = N_VSpace_Serial;
  v->ops->nvgetarraypointer = N_VGetArrayPointer_Serial;
  v->ops->nvsetarraypointer = N_VSetArrayPointer_Serial;
  v->ops->nvgetlength       = N_VGetLength_Serial;
  v->ops->nvgetlocallength  = N_VGetLength_Serial;

  /* standard vector operations */
  v->ops->nvlinearsum    = N_VLinearSum_Serial;
  v->ops->nvconst        = N_VConst_Serial;
  v->ops->nvprod         = N_VProd_Serial;
  v->ops->nvdiv          = N_VDiv_Serial;
  v->ops->nvscale        = N_VScale_Serial;
  v->ops->nvabs          = N_VAbs_Serial;
  v->ops->nvinv          = N_VInv_Serial;
  v->ops->nvaddconst     = N_VAddConst_Serial;
  v->ops->nvdotprod      = N_VDotProd_Serial;
  v->ops->nvmaxnorm      = N_VMaxNorm_Serial;
  v->ops->nvwrmsnormmask = N_VWrmsNormMask_Serial;
  v->ops->nvwrmsnorm     = N_VWrmsNorm_Serial;
  v->ops->nvmin          = N_VMin_Serial;
  v->ops->nvwl2norm      = N_VWL2Norm_Serial;
  v->ops->nvl1norm       = N_VL1Norm_Serial;
  v->ops->nvcompare      = N_VCompare_Serial;
  v->ops->nvinvtest      = N_VInvTest_Serial;
  v->ops->nvconstrmask   = N_VConstrMask_Serial;
  v->ops->nvminquotient  = N_VMinQuotient_Serial;

  /* fused and vector array operations are disabled (NULL) by default */

  /* local reduction operations */
  v->ops->nvdotprodlocal     = N_VDotProd_Serial;
  v->ops->nvmaxnormlocal     = N_VMaxNorm_Serial;
  v->ops->nvminlocal         = N_VMin_Serial;
  v->ops->nvl1normlocal      = N_VL1Norm_Serial;
  v->ops->nvinvtestlocal     = N_VInvTest_Serial;
  v->ops->nvconstrmasklocal  = N_VConstrMask_Serial;
  v->ops->nvminquotientlocal = N_VMinQuotient_Serial;
  v->ops->nvwsqrsumlocal     = N_VWSqrSumLocal_Serial;
  v->ops->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_Serial;

  /* single buffer reduction operations */
  v->ops->nvdotprodmultilocal = N_VDotProdMulti_Serial;

  /* XBraid interface operations */
  v->ops->nvbufsize   = N_VBufSize_Serial;
  v->ops->nvbufpack   = N_VBufPack_Serial;
  v->ops->nvbufunpack = N_VBufUnpack_Serial;

  /* debugging functions */
  v->ops->nvprint     = N_VPrint_Serial;
  v->ops->nvprintfile = N_VPrintFile_Serial;

  /* Create content */
  content = NULL;
  content = (N_VectorContent_Serial)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  v->content = content;

  /* Initialize content */
  content->length   = length;
  content->own_data = SUNFALSE;
  content->data     = NULL;

  return (v);
}